

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzero.cpp
# Opt level: O0

FOTerm * __thiscall
FOTerm::functor(FOTerm *__return_storage_ptr__,FOTerm *this,string *fname,
               initializer_list<FOTerm> params)

{
  bool bVar1;
  initializer_list<FOTerm> __l;
  char *pcVar2;
  string *fname_local;
  initializer_list<FOTerm> params_local;
  FOTerm *t;
  
  FOTerm(__return_storage_ptr__);
  pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
  bVar1 = false;
  if ('`' < *pcVar2) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)this);
    bVar1 = *pcVar2 < '{';
  }
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->name,(string *)this);
    __return_storage_ptr__->tag = Functor;
    __l._M_len = (size_type)params._M_array;
    __l._M_array = (iterator)fname;
    std::vector<FOTerm,_std::allocator<FOTerm>_>::operator=(&__return_storage_ptr__->params,__l);
    return __return_storage_ptr__;
  }
  __assert_fail("fname[0] >= \'a\' && fname[0] <= \'z\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/bollu[P]warren-cpp/src/lzero.cpp"
                ,0x18b,"static FOTerm FOTerm::functor(std::string, std::initializer_list<FOTerm>)");
}

Assistant:

static FOTerm functor(std::string fname,
                          std::initializer_list<FOTerm> params) {
        FOTerm t;
        // should be small letter
        assert(fname[0] >= 'a' && fname[0] <= 'z');
        t.name = fname;
        t.tag = FOTermTag::Functor;
        t.params = params;
        return t;
    }